

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  xmlNodePtr pxVar1;
  xmlNodePtr *ppxVar2;
  int iVar3;
  char *extra;
  long lVar4;
  
  lVar4 = 0;
  do {
    if (set2->nodeNr <= lVar4) {
      set2->nodeNr = 0;
      return set1;
    }
    pxVar1 = set2->nodeTab[lVar4];
    iVar3 = set1->nodeMax;
    if ((long)iVar3 == 0) {
      ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
      set1->nodeTab = ppxVar2;
      if (ppxVar2 == (xmlNodePtr *)0x0) {
LAB_001d8cad:
        extra = "merging nodeset\n";
LAB_001d8cbd:
        xmlXPathErrMemory((xmlXPathContextPtr)0x0,extra);
        return (xmlNodeSetPtr)0x0;
      }
      ppxVar2[8] = (xmlNodePtr)0x0;
      ppxVar2[9] = (xmlNodePtr)0x0;
      ppxVar2[6] = (xmlNodePtr)0x0;
      ppxVar2[7] = (xmlNodePtr)0x0;
      ppxVar2[4] = (xmlNodePtr)0x0;
      ppxVar2[5] = (xmlNodePtr)0x0;
      ppxVar2[2] = (xmlNodePtr)0x0;
      ppxVar2[3] = (xmlNodePtr)0x0;
      *ppxVar2 = (xmlNodePtr)0x0;
      ppxVar2[1] = (xmlNodePtr)0x0;
      iVar3 = 10;
LAB_001d8c8c:
      set1->nodeMax = iVar3;
    }
    else if (iVar3 <= set1->nodeNr) {
      if (9999999 < iVar3) {
        extra = "merging nodeset hit limit\n";
        goto LAB_001d8cbd;
      }
      ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(set1->nodeTab,(long)iVar3 << 4);
      if (ppxVar2 == (xmlNodePtr *)0x0) goto LAB_001d8cad;
      set1->nodeTab = ppxVar2;
      iVar3 = set1->nodeMax * 2;
      goto LAB_001d8c8c;
    }
    iVar3 = set1->nodeNr;
    set1->nodeNr = iVar3 + 1;
    set1->nodeTab[iVar3] = pxVar1;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i;
	xmlNodePtr n2;

	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
	    if (set1->nodeMax == 0) {
		set1->nodeTab = (xmlNodePtr *) xmlMalloc(
		    XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
		if (set1->nodeTab == NULL) {
		    xmlXPathErrMemory(NULL, "merging nodeset\n");
		    return(NULL);
		}
		memset(set1->nodeTab, 0,
		    XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
		set1->nodeMax = XML_NODESET_DEFAULT;
	    } else if (set1->nodeNr >= set1->nodeMax) {
		xmlNodePtr *temp;

                if (set1->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
                    xmlXPathErrMemory(NULL, "merging nodeset hit limit\n");
                    return(NULL);
                }
		temp = (xmlNodePtr *) xmlRealloc(
		    set1->nodeTab, set1->nodeMax * 2 * sizeof(xmlNodePtr));
		if (temp == NULL) {
		    xmlXPathErrMemory(NULL, "merging nodeset\n");
		    return(NULL);
		}
		set1->nodeTab = temp;
		set1->nodeMax *= 2;
	    }
	    set1->nodeTab[set1->nodeNr++] = n2;
	}
    }
    set2->nodeNr = 0;
    return(set1);
}